

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgsStreamReader.cpp
# Opt level: O2

void __thiscall PGSStreamReader::renderTextShow(PGSStreamReader *this,int64_t inTime)

{
  ushort uVar1;
  ushort uVar2;
  pointer pPVar3;
  TextToPGSConverter *this_00;
  vector<PGSStreamReader::PGSRenderedBlock,std::allocator<PGSStreamReader::PGSRenderedBlock>>
  *pvVar4;
  bool bVar5;
  uint16_t uVar6;
  uint16_t uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  uint8_t *buff;
  double dVar13;
  uint32_t mask;
  int64_t odfPTS;
  int rLen;
  uint8_t *curPos;
  uint32_t local_6c;
  long local_68;
  int local_5c;
  long local_58;
  long local_50;
  vector<PGSStreamReader::PGSRenderedBlock,std::allocator<PGSStreamReader::PGSRenderedBlock>>
  *local_48;
  long local_40;
  uint8_t *local_38;
  
  pPVar3 = (this->m_renderedBlocks).
           super__Vector_base<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_renderedBlocks).
      super__Vector_base<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
      ._M_impl.super__Vector_impl_data._M_finish != pPVar3) {
    (this->m_renderedBlocks).
    super__Vector_base<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
    ._M_impl.super__Vector_impl_data._M_finish = pPVar3;
  }
  this->m_firstRenderedPacket = true;
  local_6c = 0;
  local_48 = (vector<PGSStreamReader::PGSRenderedBlock,std::allocator<PGSStreamReader::PGSRenderedBlock>>
              *)&this->m_renderedBlocks;
  uVar10 = 0;
  while( true ) {
    bVar5 = text_subtitles::TextToPGSConverter::rlePack(this->m_render,local_6c);
    if (bVar5) break;
    *(char *)((long)&local_6c + (ulong)(uVar10 & 3)) =
         *(char *)((long)&local_6c + (ulong)(uVar10 & 3)) * '\x02' + '\x01';
    uVar10 = uVar10 + 1;
  }
  lVar8 = inTime / 0xe5b0;
  local_58 = lVar8;
  uVar6 = text_subtitles::TextToPGSConverter::renderedHeight(this->m_render);
  uVar1 = this->m_scaled_width;
  uVar2 = this->m_scaled_height;
  text_subtitles::TextToPGSConverter::renderedHeight(this->m_render);
  uVar7 = text_subtitles::TextToPGSConverter::renderedHeight(this->m_render);
  dVar13 = (double)(int)((uint)uVar6 * (uint)uVar1) * 90000.0;
  lVar11 = (long)(dVar13 / 32000000.0 + 0.999);
  lVar12 = (long)(((double)(int)((uint)uVar2 * (uint)uVar1) * 90000.0) / 32000000.0 + 0.999) +
           lVar11;
  local_50 = (long)(dVar13 / 16000000.0 + 0.999);
  this->m_objectWindowHeight = uVar7;
  uVar6 = text_subtitles::TextToPGSConverter::maxLine(this->m_render);
  this->m_objectWindowTop = uVar6;
  local_38 = this->m_renderedData;
  lVar9 = text_subtitles::TextToPGSConverter::composePresentationSegment
                    (this->m_render,local_38,Start,lVar8,lVar8 - lVar12,uVar6,
                     (this->super_AbstractStreamReader).m_demuxMode,this->m_forced_on_flag);
  local_5c = (int)lVar9;
  local_68 = lVar8 - lVar12;
  std::vector<PGSStreamReader::PGSRenderedBlock,std::allocator<PGSStreamReader::PGSRenderedBlock>>::
  emplace_back<long&,long,int&,unsigned_char*&>(local_48,&local_58,&local_68,&local_5c,&local_38);
  local_38 = local_38 + local_5c;
  lVar8 = text_subtitles::TextToPGSConverter::composeWindowDefinition
                    (this->m_render,local_38,local_58 - lVar11,local_58 - lVar12,
                     this->m_objectWindowTop,this->m_objectWindowHeight,
                     (this->super_AbstractStreamReader).m_demuxMode);
  pvVar4 = local_48;
  local_5c = (int)lVar8;
  local_68 = local_58 - lVar11;
  local_40 = local_58 - lVar12;
  std::vector<PGSStreamReader::PGSRenderedBlock,std::allocator<PGSStreamReader::PGSRenderedBlock>>::
  emplace_back<long,long,int&,unsigned_char*&>(local_48,&local_68,&local_40,&local_5c,&local_38);
  local_38 = local_38 + local_5c;
  lVar8 = text_subtitles::TextToPGSConverter::composePaletteDefinition
                    (this->m_render,&this->m_render->m_paletteByColor,local_38,local_58 - lVar12,
                     local_58 - lVar12,(this->super_AbstractStreamReader).m_demuxMode);
  local_5c = (int)lVar8;
  local_68 = local_58 - lVar12;
  local_40 = local_68;
  std::vector<PGSStreamReader::PGSRenderedBlock,std::allocator<PGSStreamReader::PGSRenderedBlock>>::
  emplace_back<long,long,int&,unsigned_char*&>(pvVar4,&local_68,&local_40,&local_5c,&local_38);
  buff = local_38 + local_5c;
  lVar8 = local_58 - lVar12;
  local_68 = local_50 + lVar8;
  this_00 = this->m_render;
  local_50 = local_68;
  local_38 = buff;
  uVar6 = text_subtitles::TextToPGSConverter::minLine(this_00);
  uVar7 = text_subtitles::TextToPGSConverter::maxLine(this->m_render);
  lVar8 = text_subtitles::TextToPGSConverter::composeObjectDefinition
                    (this_00,buff,local_50,lVar8,(uint)uVar6,(uint)uVar7,
                     (this->super_AbstractStreamReader).m_demuxMode);
  pvVar4 = local_48;
  local_5c = (int)lVar8;
  local_40 = local_58 - lVar12;
  std::vector<PGSStreamReader::PGSRenderedBlock,std::allocator<PGSStreamReader::PGSRenderedBlock>>::
  emplace_back<long_const&,long,int&,unsigned_char*&>
            (local_48,&local_68,&local_40,&local_5c,&local_38);
  local_38 = local_38 + local_5c;
  lVar8 = text_subtitles::TextToPGSConverter::composeEnd
                    (this->m_render,local_38,local_68,local_68,
                     (this->super_AbstractStreamReader).m_demuxMode);
  local_5c = (int)lVar8;
  std::vector<PGSStreamReader::PGSRenderedBlock,std::allocator<PGSStreamReader::PGSRenderedBlock>>::
  emplace_back<long_const&,long_const&,int&,unsigned_char*&>
            (pvVar4,&local_68,&local_68,&local_5c,&local_38);
  return;
}

Assistant:

void PGSStreamReader::renderTextShow(int64_t inTime)
{
    m_renderedBlocks.clear();
    m_firstRenderedPacket = true;

    uint32_t mask = 0;
    int step = 0;
    while (!m_render->rlePack(mask))
    {
        // reduce colors
        const auto tmp = reinterpret_cast<uint8_t*>(&mask);
        const int idx = step++ % 4;
        tmp[idx] <<= 1;
        tmp[idx]++;
    }
    inTime = inTime / INT_FREQ_TO_TS_FREQ;

    const double decodedObjectSize = m_render->renderedHeight() * m_scaled_width;
    const auto compositionDecodeTime = static_cast<int64_t>(90000.0 * decodedObjectSize / PIXEL_DECODING_RATE + 0.999);
    const auto windowsTransferTime = static_cast<int64_t>(90000.0 * decodedObjectSize / PIXEL_COMPOSITION_RATE + 0.999);
    const auto PLANEINITIALIZATIONTIME =
        static_cast<int64_t>(90000.0 * (m_scaled_width * m_scaled_height) / PIXEL_COMPOSITION_RATE + 0.999);
    const int64_t PRESENTATION_DTS_DELTA = PLANEINITIALIZATIONTIME + windowsTransferTime;

    m_objectWindowHeight = FFMAX(0, m_render->renderedHeight());
    m_objectWindowTop = m_render->maxLine();

    // show text
    uint8_t* curPos = m_renderedData;
    // composition segment. pts=x,  dts = x-0.0648 (pts alignment to video grid) (I get constant value from real PGS
    // track as example)
    int rLen =
        m_render->composePresentationSegment(curPos, CompositionMode::Start, inTime, inTime - PRESENTATION_DTS_DELTA,
                                             m_objectWindowTop, m_demuxMode, m_forced_on_flag);
    m_renderedBlocks.emplace_back(inTime, inTime - PRESENTATION_DTS_DELTA, rLen, curPos);
    curPos += rLen;
    // window definition.   pts=x-0.001, dts = x-0.0648
    rLen = m_render->composeWindowDefinition(curPos, inTime - windowsTransferTime, inTime - PRESENTATION_DTS_DELTA,
                                             m_objectWindowTop, m_objectWindowHeight, m_demuxMode);
    m_renderedBlocks.emplace_back(inTime - windowsTransferTime, inTime - PRESENTATION_DTS_DELTA, rLen, curPos);
    curPos += rLen;

    // palette.             pts=x-0.0648, dts = x-0.0648
    rLen = m_render->composePaletteDefinition(m_render->m_paletteByColor, curPos, inTime - PRESENTATION_DTS_DELTA,
                                              inTime - PRESENTATION_DTS_DELTA, m_demuxMode);
    m_renderedBlocks.emplace_back(inTime - PRESENTATION_DTS_DELTA, inTime - PRESENTATION_DTS_DELTA, rLen, curPos);
    curPos += rLen;
    // object               pts=x-0.0627, dts = x-0.0648
    // inTime - 5643
    const int64_t odfPTS = inTime - PRESENTATION_DTS_DELTA + compositionDecodeTime;
    rLen = m_render->composeObjectDefinition(curPos, odfPTS, inTime - PRESENTATION_DTS_DELTA, m_render->minLine(),
                                             m_render->maxLine(), m_demuxMode);
    m_renderedBlocks.emplace_back(odfPTS, inTime - PRESENTATION_DTS_DELTA, rLen, curPos);
    curPos += rLen;
    // end                  pts=x-0.0627, dts = x-0.0627
    rLen = m_render->composeEnd(curPos, odfPTS, odfPTS, m_demuxMode);
    m_renderedBlocks.emplace_back(odfPTS, odfPTS, rLen, curPos);
}